

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O2

uint64_t calc_next_pn_to_skip(ptls_context_t *tlsctx,uint64_t next_pn,uint32_t cwnd,uint64_t mtu)

{
  long lVar1;
  uint uVar2;
  long lVar3;
  uint uVar4;
  long *in_FS_OFFSET;
  
  lVar1 = *in_FS_OFFSET;
  lVar3 = in_FS_OFFSET[-1];
  if (lVar3 == 0) {
    (*tlsctx->random_bytes)((void *)(lVar1 + -0x28),0x20);
    lVar3 = 8;
  }
  uVar2 = (uint)(cwnd / mtu);
  uVar4 = 0x20;
  if (0x20 < uVar2) {
    uVar4 = uVar2;
  }
  in_FS_OFFSET[-1] = lVar3 + -1;
  return next_pn + (ulong)*(uint *)(lVar1 + -0x2c + lVar3 * 4) % (ulong)(uVar4 << 4) + 1;
}

Assistant:

static uint64_t calc_next_pn_to_skip(ptls_context_t *tlsctx, uint64_t next_pn, uint32_t cwnd, uint64_t mtu)
{
    static __thread struct {
        uint32_t values[8];
        size_t off;
    } cached_rand;

    if (cached_rand.off == 0) {
        tlsctx->random_bytes(cached_rand.values, sizeof(cached_rand.values));
        cached_rand.off = PTLS_ELEMENTSOF(cached_rand.values);
    }

    /* on average, skip one PN per every min(256 packets, 8 * CWND) */
    uint32_t packet_cwnd = cwnd / mtu;
    if (packet_cwnd < 32)
        packet_cwnd = 32;
    uint64_t skip_after = cached_rand.values[--cached_rand.off] % (16 * packet_cwnd);
    return next_pn + 1 + skip_after;
}